

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

UpdateType __thiscall
libDAI::Properties::FromStringTo<libDAI::IJGP::UpdateType>(Properties *this,PropertyKey *key)

{
  bool bVar1;
  any *in_RDI;
  stringstream ss;
  PropertyValue val;
  UpdateType result;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  ostream *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  string local_1d8 [32];
  UpdateType *in_stack_fffffffffffffe48;
  istream *in_stack_fffffffffffffe50;
  stringstream local_1a8 [8];
  PropertyKey *in_stack_fffffffffffffe60;
  Properties *in_stack_fffffffffffffe68;
  UpdateType local_4;
  
  Get((Properties *)in_stack_fffffffffffffe10,
      (PropertyKey *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  boost::any::any((any *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_RDI);
  boost::any::type((any *)in_stack_fffffffffffffe10);
  bVar1 = std::type_info::operator!=
                    ((type_info *)in_stack_fffffffffffffe10,
                     (type_info *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    in_stack_fffffffffffffe10 = (ostream *)&stack0xfffffffffffffe68;
    GetAs<std::__cxx11::string>(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::operator<<(in_stack_fffffffffffffe10,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    IJGP::UpdateType::UpdateType(&local_4);
    libDAI::operator>>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    local_4 = GetAs<libDAI::IJGP::UpdateType>(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  boost::any::~any((any *)in_stack_fffffffffffffe10);
  return (UpdateType)local_4.v;
}

Assistant:

ValueType FromStringTo(const PropertyKey &key) const { 
                PropertyValue val = Get(key);
                if( val.type() != typeid(ValueType) ) {
                    assert( val.type() == typeid(std::string) );

                    std::stringstream ss;
                    ss << GetAs<std::string>(key);
                    ValueType result;
                    ss >> result;

                    return result;
                } else
                    return GetAs<ValueType>(key);
            }